

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocalsocket_unix.cpp
# Opt level: O3

LocalSocketError __thiscall QLocalSocket::error(QLocalSocket *this)

{
  SocketError SVar1;
  LocalSocketError LVar2;
  
  SVar1 = QAbstractSocket::error((QAbstractSocket *)(*(long *)&this->field_0x8 + 0x188));
  LVar2 = UnknownSocketError;
  if ((uint)(SVar1 + RemoteHostClosedError) < 0xc) {
    LVar2 = *(LocalSocketError *)(&DAT_0027d46c + (ulong)(uint)(SVar1 + RemoteHostClosedError) * 4);
  }
  return LVar2;
}

Assistant:

QLocalSocket::LocalSocketError QLocalSocket::error() const
{
    Q_D(const QLocalSocket);
    switch (d->unixSocket.error()) {
    case QAbstractSocket::ConnectionRefusedError:
        return QLocalSocket::ConnectionRefusedError;
    case QAbstractSocket::RemoteHostClosedError:
        return QLocalSocket::PeerClosedError;
    case QAbstractSocket::HostNotFoundError:
        return QLocalSocket::ServerNotFoundError;
    case QAbstractSocket::SocketAccessError:
        return QLocalSocket::SocketAccessError;
    case QAbstractSocket::SocketResourceError:
        return QLocalSocket::SocketResourceError;
    case QAbstractSocket::SocketTimeoutError:
        return QLocalSocket::SocketTimeoutError;
    case QAbstractSocket::DatagramTooLargeError:
        return QLocalSocket::DatagramTooLargeError;
    case QAbstractSocket::NetworkError:
        return QLocalSocket::ConnectionError;
    case QAbstractSocket::UnsupportedSocketOperationError:
        return QLocalSocket::UnsupportedSocketOperationError;
    case QAbstractSocket::UnknownSocketError:
        return QLocalSocket::UnknownSocketError;
    default:
#if defined QLOCALSOCKET_DEBUG
        qWarning() << "QLocalSocket error not handled:" << d->unixSocket.error();
#endif
        break;
    }
    return UnknownSocketError;
}